

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O0

AggregateFunction *
duckdb::AggregateFunction::
BinaryAggregate<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::string_t,duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,(duckdb::AggregateDestructorType)1>
          (LogicalType *a_type,LogicalType *b_type,LogicalType *return_type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  aggregate_simple_update_t in_RCX;
  bind_aggregate_function_t in_RDX;
  aggregate_destructor_t in_RSI;
  AggregateFunction *in_RDI;
  aggregate_window_t unaff_retaddr;
  aggregate_serialize_t in_stack_00000008;
  aggregate_deserialize_t in_stack_00000010;
  LogicalType *in_stack_fffffffffffffeb8;
  LogicalType *in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  undefined1 **local_c0;
  aggregate_initialize_t in_stack_ffffffffffffff70;
  aggregate_size_t in_stack_ffffffffffffff78;
  LogicalType *return_type_00;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff88;
  AggregateFunction *in_stack_ffffffffffffff90;
  LogicalType local_60;
  undefined1 *local_48;
  undefined8 local_40;
  aggregate_combine_t in_stack_ffffffffffffffd0;
  aggregate_finalize_t in_stack_ffffffffffffffd8;
  AggregateFunction *statistics;
  
  statistics = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  return_type_00 = &local_60;
  LogicalType::LogicalType(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_48 = &stack0xffffffffffffff88;
  local_40 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1c4d911);
  iVar1._M_len = in_stack_fffffffffffffed0;
  iVar1._M_array = in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffec0,iVar1,
             (allocator_type *)in_stack_fffffffffffffeb8);
  AggregateFunction(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,return_type_00,
                    in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(aggregate_update_t)in_RDI,
                    in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,in_RCX,in_RDX,in_RSI,
                    (aggregate_statistics_t)statistics,unaff_retaddr,in_stack_00000008,
                    in_stack_00000010);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1c4d9d4);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1c4d9e1);
  local_c0 = &local_48;
  do {
    local_c0 = local_c0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x1c4da13);
  } while (local_c0 != (undefined1 **)&stack0xffffffffffffff88);
  return in_RDI;
}

Assistant:

static AggregateFunction BinaryAggregate(const LogicalType &a_type, const LogicalType &b_type,
	                                         LogicalType return_type) {
		return AggregateFunction({a_type, b_type}, return_type, AggregateFunction::StateSize<STATE>,
		                         AggregateFunction::StateInitialize<STATE, OP, destructor_type>,
		                         AggregateFunction::BinaryScatterUpdate<STATE, A_TYPE, B_TYPE, OP>,
		                         AggregateFunction::StateCombine<STATE, OP>,
		                         AggregateFunction::StateFinalize<STATE, RESULT_TYPE, OP>,
		                         AggregateFunction::BinaryUpdate<STATE, A_TYPE, B_TYPE, OP>);
	}